

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  pointer pcVar1;
  cmLocalGenerator *this;
  bool bVar2;
  char *pcVar3;
  cmSourceFile *this_00;
  string *psVar4;
  cmake *this_01;
  cmListFileBacktrace *r;
  ostream *poVar5;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  undefined4 uVar9;
  pointer pbVar10;
  pointer *ppbVar11;
  pointer sourceName;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  undefined7 in_stack_00000009;
  char in_stack_00000010;
  undefined4 local_2ac;
  string e;
  string fullPath;
  string local_260;
  pointer *local_240;
  cmake *local_238;
  undefined4 local_22c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  long *local_208 [2];
  long local_1f8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e8;
  cmGeneratorExpressionDAGChecker *local_1e0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  cmMakefile *local_1d0;
  string usedSources;
  ios_base local_158 [264];
  cmListFileBacktrace local_50;
  
  if (entries ==
      (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       *)srcs) {
    local_2ac = 0;
  }
  else {
    local_1d0 = tgt->Target->Makefile;
    local_22c = SUB84(local_1d0,0);
    local_2ac = 0;
    local_1e8 = srcs;
    local_1e0 = (cmGeneratorExpressionDAGChecker *)config;
    local_1d8 = uniqueSrcs;
    do {
      local_238 = (cmake *)(*(pointer *)entries)->_M_string_length;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      e._M_dataplus._M_p = (pointer)&e.field_2;
      e._M_string_length = 0;
      e.field_2._M_allocated_capacity = e.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_240 = (pointer *)entries;
      pcVar3 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)((*(pointer *)entries)->_M_dataplus)._M_p
                          ,tgt->LocalGenerator,(string *)CONCAT71(in_stack_00000009,debugSources),
                          false,tgt,tgt,local_1e0,&e);
      std::__cxx11::string::string((string *)&usedSources,pcVar3,(allocator *)&fullPath);
      uVar9 = local_22c;
      cmSystemTools::ExpandListArgument(&usedSources,&entrySources,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)e._M_dataplus._M_p != &e.field_2) {
        operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
      }
      if (((*local_240)->_M_dataplus)._M_p[0x140] != '\0') {
        local_2ac = 1;
      }
      sourceName = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      if (entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
        ppbVar11 = local_240;
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      }
      else {
        do {
          this_00 = cmMakefile::GetOrCreateSource(local_1d0,sourceName,false);
          e._M_dataplus._M_p = (pointer)&e.field_2;
          e._M_string_length = 0;
          e.field_2._M_allocated_capacity = e.field_2._M_allocated_capacity & 0xffffffffffffff00;
          psVar4 = cmSourceFile::GetFullPath(this_00,&e);
          fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
          pcVar1 = (psVar4->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&fullPath,pcVar1,pcVar1 + psVar4->_M_string_length);
          if (fullPath._M_string_length == 0) {
            if (e._M_string_length != 0) {
              this_01 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
              r = cmTarget::GetBacktrace(tgt->Target);
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&usedSources,r);
              cmake::IssueMessage(this_01,FATAL_ERROR,&e,(cmListFileBacktrace *)&usedSources);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&usedSources);
            }
LAB_0040f8ce:
            bVar2 = false;
            uVar9 = local_2ac;
          }
          else {
            if (((local_238->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) &&
               (bVar2 = cmsys::SystemTools::FileIsFullPath((sourceName->_M_dataplus)._M_p), !bVar2))
            {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&usedSources);
              if ((local_238->Generators).
                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&usedSources,
                           "Found relative path while evaluating sources of \"",0x31);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&usedSources,(tgt->Target->Name)._M_dataplus._M_p,
                                    (tgt->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  \"",6);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar5,(sourceName->_M_dataplus)._M_p,
                                    sourceName->_M_string_length);
                lVar8 = 2;
                pcVar3 = "\"\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&usedSources,"Target \"",8);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&usedSources,
                                    (char *)(local_238->Generators).
                                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                    (long)(local_238->Generators).
                                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar5,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36);
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar5,(sourceName->_M_dataplus)._M_p,
                                    sourceName->_M_string_length);
                lVar8 = 1;
                pcVar3 = "\"";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar3,lVar8);
              this = tgt->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_260);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usedSources);
              std::ios_base::~ios_base(local_158);
              goto LAB_0040f8ce;
            }
            bVar2 = true;
            std::__cxx11::string::_M_assign((string *)sourceName);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
            operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)e._M_dataplus._M_p != &e.field_2) {
            operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
          }
          if (!bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entrySources);
            local_2ac = uVar9;
            goto LAB_0040fd40;
          }
          sourceName = sourceName + 1;
        } while (sourceName !=
                 entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
        ppbVar11 = local_240;
        pbVar10 = entrySources.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_22c = uVar9;
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
        if (sourceName !=
            entrySources.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            e._M_dataplus._M_p = (pointer)&e.field_2;
            pcVar1 = (pbVar10->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&e,pcVar1,pcVar1 + pbVar10->_M_string_length);
            fullPath._M_dataplus._M_p = (pointer)dagChecker;
            pVar12 = std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)dagChecker,&e,&fullPath);
            if ((((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1d8,&e), in_stack_00000010 != '\0')) {
              std::operator+(&local_260," * ",&e);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
              fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
              psVar7 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar7) {
                fullPath.field_2._M_allocated_capacity = *psVar7;
                fullPath.field_2._8_8_ = plVar6[3];
              }
              else {
                fullPath.field_2._M_allocated_capacity = *psVar7;
                fullPath._M_dataplus._M_p = (pointer)*plVar6;
              }
              fullPath._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&usedSources,(ulong)fullPath._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
                operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)e._M_dataplus._M_p != &e.field_2) {
              operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 !=
                   entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          ppbVar11 = local_240;
          if (usedSources._M_string_length != 0) {
            local_238 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
            ppbVar11 = local_240;
            local_208[0] = local_1f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_208,"Used sources for target ","");
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_208,
                                        (ulong)(tgt->Target->Name)._M_dataplus._M_p);
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            psVar7 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_260.field_2._M_allocated_capacity = *psVar7;
              local_260.field_2._8_8_ = plVar6[3];
            }
            else {
              local_260.field_2._M_allocated_capacity = *psVar7;
              local_260._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_260._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
            fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
            psVar7 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar7) {
              fullPath.field_2._M_allocated_capacity = *psVar7;
              fullPath.field_2._8_8_ = plVar6[3];
            }
            else {
              fullPath.field_2._M_allocated_capacity = *psVar7;
              fullPath._M_dataplus._M_p = (pointer)*plVar6;
            }
            fullPath._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&fullPath,(ulong)usedSources._M_dataplus._M_p);
            e._M_dataplus._M_p = (pointer)&e.field_2;
            psVar7 = (size_type *)(plVar6 + 2);
            if ((size_type *)*plVar6 == psVar7) {
              e.field_2._M_allocated_capacity = *psVar7;
              e.field_2._8_8_ = plVar6[3];
            }
            else {
              e.field_2._M_allocated_capacity = *psVar7;
              e._M_dataplus._M_p = (pointer)*plVar6;
            }
            e._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            cmListFileBacktrace::cmListFileBacktrace
                      (&local_50,(cmListFileBacktrace *)((*ppbVar11)->_M_dataplus)._M_p);
            cmake::IssueMessage(local_238,LOG,&e,&local_50);
            cmListFileBacktrace::~cmListFileBacktrace(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)e._M_dataplus._M_p != &e.field_2) {
              operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
              operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&entrySources);
      entries = (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)(ppbVar11 + 1);
    } while (entries !=
             (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              *)local_1e8);
  }
LAB_0040fd40:
  return (bool)((byte)local_2ac & 1);
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<std::string>& srcs, CM_UNORDERED_SET<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (std::vector<cmGeneratorTarget::TargetPropertyEntry *>::const_iterator
         it = entries.begin(),
         end = entries.end();
       it != end; ++it) {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(
      (*it)->ge->Evaluate(tgt->GetLocalGenerator(), config, false, tgt, tgt,
                          dagChecker),
      entrySources);

    if ((*it)->ge->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::vector<std::string>::iterator i = entrySources.begin();
         i != entrySources.end(); ++i) {
      std::string& src = *i;
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(cmake::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src.c_str())) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative "
                 "path in its INTERFACE_SOURCES:\n"
                 "  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of "
                 "\""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(cmake::FATAL_ERROR, err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::vector<std::string>::iterator li = entrySources.begin();
         li != entrySources.end(); ++li) {
      std::string src = *li;

      if (uniqueSrcs.insert(src).second) {
        srcs.push_back(src);
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        cmake::LOG, std::string("Used sources for target ") + tgt->GetName() +
          ":\n" + usedSources,
        (*it)->ge->GetBacktrace());
    }
  }
  return contextDependent;
}